

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int aec_encode_init(aec_stream *strm)

{
  uint uVar1;
  uint uVar2;
  sbyte sVar3;
  internal_state *piVar5;
  code *pcVar6;
  uint32_t *puVar7;
  uint32_t *puVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  size_t __size;
  int iVar4;
  
  uVar1 = strm->bits_per_sample;
  if (uVar1 - 0x21 < 0xffffffe0) {
    return -1;
  }
  uVar13 = strm->block_size;
  uVar2 = strm->flags;
  if ((uVar2 & 0x40) == 0) {
    uVar11 = uVar13 - 8 >> 3;
    if (7 < (uVar13 << 0x1d | uVar11)) {
      return -1;
    }
    if ((0x8bU >> (uVar11 & 0x1f) & 1) == 0) {
      return -1;
    }
  }
  else if ((uVar13 & 1) != 0) {
    return -1;
  }
  uVar11 = strm->rsi;
  if (0x1000 < uVar11) {
    return -1;
  }
  piVar5 = (internal_state *)calloc(1,0x1b0);
  iVar9 = -4;
  if (piVar5 == (internal_state *)0x0) {
    return -4;
  }
  strm->state = piVar5;
  piVar5->uncomp_len = uVar13 * uVar1;
  iVar10 = 1;
  if (uVar1 < 0x11) {
    if (uVar1 < 9) {
      if ((uVar2 & 0x10) == 0) {
        piVar5->id_len = 3;
        iVar4 = 3;
      }
      else {
        if (4 < uVar1) {
          return -1;
        }
        if (uVar1 < 3) {
          piVar5->id_len = 1;
          iVar4 = iVar10;
        }
        else {
          piVar5->id_len = 2;
          iVar4 = 2;
        }
      }
      sVar3 = (sbyte)iVar4;
      piVar5->bytes_per_sample = 1;
      piVar5->get_sample = aec_get_8;
      piVar5->get_rsi = aec_get_rsi_8;
    }
    else {
      piVar5->id_len = 4;
      piVar5->bytes_per_sample = 2;
      if ((uVar2 & 4) == 0) {
        piVar5->get_sample = aec_get_lsb_16;
        pcVar6 = aec_get_rsi_lsb_16;
      }
      else {
        piVar5->get_sample = aec_get_msb_16;
        pcVar6 = aec_get_rsi_msb_16;
      }
      piVar5->get_rsi = pcVar6;
      iVar10 = 2;
      sVar3 = 4;
    }
  }
  else {
    piVar5->id_len = 5;
    if ((uVar2 & 2) == 0 || 0x18 < uVar1) {
      piVar5->bytes_per_sample = 4;
      if ((uVar2 & 4) == 0) {
        piVar5->get_sample = aec_get_lsb_32;
        pcVar6 = aec_get_rsi_lsb_32;
      }
      else {
        piVar5->get_sample = aec_get_msb_32;
        pcVar6 = aec_get_rsi_msb_32;
      }
      piVar5->get_rsi = pcVar6;
      iVar10 = 4;
    }
    else {
      piVar5->bytes_per_sample = 3;
      if ((uVar2 & 4) == 0) {
        piVar5->get_sample = aec_get_lsb_24;
        pcVar6 = aec_get_rsi_lsb_24;
      }
      else {
        piVar5->get_sample = aec_get_msb_24;
        pcVar6 = aec_get_rsi_msb_24;
      }
      piVar5->get_rsi = pcVar6;
      iVar10 = 3;
    }
    sVar3 = 5;
  }
  uVar13 = uVar13 * uVar11;
  uVar11 = uVar2 & 1;
  uVar12 = (uint)(-1L << ((byte)uVar1 - 1 & 0x3f));
  uVar1 = (uint)(-1L << ((byte)uVar1 & 0x3f));
  if (uVar11 != 0) {
    uVar1 = uVar12;
  }
  pcVar6 = preprocess_signed;
  if (uVar11 == 0) {
    pcVar6 = preprocess_unsigned;
  }
  piVar5->rsi_len = iVar10 * uVar13;
  piVar5->xmax = ~uVar1;
  piVar5->xmin = -uVar11 & uVar12;
  piVar5->preprocess = pcVar6;
  piVar5->kmax = (1 << sVar3) + -3;
  __size = (ulong)uVar13 << 2;
  puVar7 = (uint32_t *)malloc(__size);
  piVar5->data_pp = puVar7;
  if (puVar7 == (uint32_t *)0x0) {
LAB_001016b5:
    cleanup((EVP_PKEY_CTX *)strm);
  }
  else {
    if ((uVar2 & 8) == 0) {
      piVar5->data_raw = puVar7;
    }
    else {
      puVar8 = (uint32_t *)malloc(__size);
      piVar5->data_raw = puVar8;
      if (puVar8 == (uint32_t *)0x0) goto LAB_001016b5;
    }
    piVar5->block = puVar7;
    piVar5->ref = 0;
    strm->total_in = 0;
    strm->total_out = 0;
    piVar5->flushed = 0;
    piVar5->cds = piVar5->cds_buf;
    piVar5->cds_buf[0] = '\0';
    piVar5->bits = 8;
    piVar5->mode = m_get_block;
    piVar5->ready_to_capture_rsi = 0;
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int aec_encode_init(struct aec_stream *strm)
{
    struct internal_state *state;

    if (strm->bits_per_sample > 32 || strm->bits_per_sample == 0)
        return AEC_CONF_ERROR;

    if (strm->flags & AEC_NOT_ENFORCE) {
        /* All even block sizes are allowed. */
        if (strm->block_size & 1)
            return AEC_CONF_ERROR;
    } else {
        /* Only allow standard conforming block sizes */
        if (strm->block_size != 8
            && strm->block_size != 16
            && strm->block_size != 32
            && strm->block_size != 64)
            return AEC_CONF_ERROR;
    }

    if (strm->rsi > 4096)
        return AEC_CONF_ERROR;

    state = malloc(sizeof(struct internal_state));
    if (state == NULL)
        return AEC_MEM_ERROR;

    memset(state, 0, sizeof(struct internal_state));
    strm->state = state;
    state->uncomp_len = strm->block_size * strm->bits_per_sample;

    if (strm->bits_per_sample > 16) {
        /* 24/32 input bit settings */
        state->id_len = 5;

        if (strm->bits_per_sample <= 24
            && strm->flags & AEC_DATA_3BYTE) {
            state->bytes_per_sample = 3;
            if (strm->flags & AEC_DATA_MSB) {
                state->get_sample = aec_get_msb_24;
                state->get_rsi = aec_get_rsi_msb_24;
            } else {
                state->get_sample = aec_get_lsb_24;
                state->get_rsi = aec_get_rsi_lsb_24;
            }
        } else {
            state->bytes_per_sample = 4;
            if (strm->flags & AEC_DATA_MSB) {
                state->get_sample = aec_get_msb_32;
                state->get_rsi = aec_get_rsi_msb_32;
            } else {
                state->get_sample = aec_get_lsb_32;
                state->get_rsi = aec_get_rsi_lsb_32;
            }
        }
    }
    else if (strm->bits_per_sample > 8) {
        /* 16 bit settings */
        state->id_len = 4;
        state->bytes_per_sample = 2;

        if (strm->flags & AEC_DATA_MSB) {
            state->get_sample = aec_get_msb_16;
            state->get_rsi = aec_get_rsi_msb_16;
        } else {
            state->get_sample = aec_get_lsb_16;
            state->get_rsi = aec_get_rsi_lsb_16;
        }
    } else {
        /* 8 bit settings */
        if (strm->flags & AEC_RESTRICTED) {
            if (strm->bits_per_sample <= 4) {
                if (strm->bits_per_sample <= 2)
                    state->id_len = 1;
                else
                    state->id_len = 2;
            } else {
                return AEC_CONF_ERROR;
            }
        } else {
            state->id_len = 3;
        }
        state->bytes_per_sample = 1;

        state->get_sample = aec_get_8;
        state->get_rsi = aec_get_rsi_8;
    }
    state->rsi_len = strm->rsi * strm->block_size * state->bytes_per_sample;

    if (strm->flags & AEC_DATA_SIGNED) {
        state->xmax = (INT64_C(1) << (strm->bits_per_sample - 1)) - 1;
        state->xmin = ~state->xmax;
        state->preprocess = preprocess_signed;
    } else {
        state->xmax = (UINT64_C(1) << strm->bits_per_sample) - 1;
        state->xmin = 0;
        state->preprocess = preprocess_unsigned;
    }

    state->kmax = (1U << state->id_len) - 3;

    state->data_pp = malloc(strm->rsi
                            * strm->block_size
                            * sizeof(uint32_t));
    if (state->data_pp == NULL) {
        cleanup(strm);
        return AEC_MEM_ERROR;
    }

    if (strm->flags & AEC_DATA_PREPROCESS) {
        state->data_raw = malloc(strm->rsi
                                 * strm->block_size
                                 * sizeof(uint32_t));
        if (state->data_raw == NULL) {
            cleanup(strm);
            return AEC_MEM_ERROR;
        }
    } else {
        state->data_raw = state->data_pp;
    }

    state->block = state->data_pp;

    state->ref = 0;
    strm->total_in = 0;
    strm->total_out = 0;
    state->flushed = 0;

    state->cds = state->cds_buf;
    *state->cds = 0;
    state->bits = 8;
    state->mode = m_get_block;
    state->ready_to_capture_rsi = 0;
    return AEC_OK;
}